

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>::parse_event
          (parse_event<char,_std::allocator<char>_> *this,int64_t value,semantic_tag tag,
          allocator<char> *alloc)

{
  allocator *in_RCX;
  allocator<unsigned_char> in_DL;
  undefined8 in_RSI;
  allocator<unsigned_char> *in_RDI;
  string *this_00;
  
  *in_RDI = (allocator<unsigned_char>)0x5;
  this_00 = (string *)(in_RDI + 8);
  std::__cxx11::string::string(this_00,in_RCX);
  std::allocator<unsigned_char>::allocator<char>(in_RDI,(allocator<char> *)this_00);
  basic_byte_string<std::allocator<unsigned_char>_>::basic_byte_string
            ((basic_byte_string<std::allocator<unsigned_char>_> *)in_RDI,
             (allocator<unsigned_char> *)this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3efcc5);
  *(undefined8 *)(in_RDI + 0x40) = in_RSI;
  in_RDI[0x48] = in_DL;
  return;
}

Assistant:

parse_event(int64_t value, semantic_tag tag, const TempAllocator& alloc)
            : event_type(staj_event_type::int64_value), 
              string_value(alloc),
              byte_string_value(alloc),
              int64_value(value), 
              tag(tag)
        {
        }